

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

SampledSpectrum __thiscall pbrt::SpotLight::Phi(SpotLight *this,SampledWavelengths *lambda)

{
  undefined1 auVar1 [16];
  float fVar2;
  float fVar7;
  undefined1 auVar3 [16];
  float fVar6;
  float fVar9;
  undefined1 auVar4 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar11 [56];
  SampledSpectrum SVar12;
  undefined1 auVar5 [64];
  undefined1 auVar8 [56];
  undefined1 auVar10 [64];
  
  auVar11 = in_ZMM1._8_56_;
  fVar9 = this->scale;
  auVar3._4_4_ = fVar9;
  auVar3._0_4_ = fVar9;
  auVar3._8_4_ = fVar9;
  auVar3._12_4_ = fVar9;
  auVar8 = ZEXT856(auVar3._8_8_);
  SVar12 = DenselySampledSpectrum::Sample(&this->Iemit,lambda);
  auVar10._0_8_ = SVar12.values.values._8_8_;
  auVar10._8_56_ = auVar11;
  auVar5._0_8_ = SVar12.values.values._0_8_;
  auVar5._8_56_ = auVar8;
  auVar1 = vmovlhps_avx(auVar5._0_16_,auVar10._0_16_);
  fVar2 = auVar1._0_4_ * fVar9;
  fVar6 = auVar1._4_4_ * fVar9;
  fVar7 = auVar1._8_4_ * fVar9;
  fVar9 = auVar1._12_4_ * fVar9;
  auVar4._0_4_ = fVar2 + fVar2;
  auVar4._4_4_ = fVar6 + fVar6;
  auVar4._8_4_ = fVar7 + fVar7;
  auVar4._12_4_ = fVar9 + fVar9;
  auVar1._8_4_ = 0x40490fdb;
  auVar1._0_8_ = 0x40490fdb40490fdb;
  auVar1._12_4_ = 0x40490fdb;
  auVar1 = vmulps_avx512vl(auVar4,auVar1);
  fVar9 = (1.0 - this->cosFalloffStart) + (this->cosFalloffStart - this->cosFalloffEnd) * 0.5;
  fVar2 = fVar9 * auVar1._0_4_;
  fVar6 = fVar9 * auVar1._4_4_;
  auVar1 = CONCAT412(fVar9 * auVar1._12_4_,CONCAT48(fVar9 * auVar1._8_4_,CONCAT44(fVar6,fVar2)));
  auVar1 = vshufpd_avx(auVar1,auVar1,1);
  SVar12.values.values._8_8_ = auVar1._0_8_;
  SVar12.values.values[0] = fVar2;
  SVar12.values.values[1] = fVar6;
  return (SampledSpectrum)SVar12.values.values;
}

Assistant:

SampledSpectrum SpotLight::Phi(const SampledWavelengths &lambda) const {
    return scale * Iemit.Sample(lambda) * 2 * Pi *
           ((1 - cosFalloffStart) + (cosFalloffStart - cosFalloffEnd) / 2);
}